

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtUnionFind.h
# Opt level: O3

void __thiscall cbtUnionFind::unite(cbtUnionFind *this,int p,int q)

{
  cbtElement *pcVar1;
  int iVar2;
  cbtElement *pcVar3;
  
  pcVar1 = (this->m_elements).m_data;
  iVar2 = pcVar1[p].m_id;
  if (iVar2 != p) {
    pcVar3 = pcVar1 + p;
    do {
      p = pcVar1[iVar2].m_id;
      pcVar3->m_id = p;
      pcVar3 = pcVar1 + p;
      iVar2 = pcVar3->m_id;
    } while (p != iVar2);
  }
  iVar2 = pcVar1[q].m_id;
  if (iVar2 != q) {
    pcVar3 = pcVar1 + q;
    do {
      q = pcVar1[iVar2].m_id;
      pcVar3->m_id = q;
      pcVar3 = pcVar1 + q;
      iVar2 = pcVar3->m_id;
    } while (q != iVar2);
  }
  if (p != q) {
    pcVar1[p].m_id = q;
    pcVar1[q].m_sz = pcVar1[q].m_sz + pcVar1[p].m_sz;
  }
  return;
}

Assistant:

void unite(int p, int q)
	{
		int i = find(p), j = find(q);
		if (i == j)
			return;

#ifndef USE_PATH_COMPRESSION
		//weighted quick union, this keeps the 'trees' balanced, and keeps performance of unite O( log(n) )
		if (m_elements[i].m_sz < m_elements[j].m_sz)
		{
			m_elements[i].m_id = j;
			m_elements[j].m_sz += m_elements[i].m_sz;
		}
		else
		{
			m_elements[j].m_id = i;
			m_elements[i].m_sz += m_elements[j].m_sz;
		}
#else
		m_elements[i].m_id = j;
		m_elements[j].m_sz += m_elements[i].m_sz;
#endif  //USE_PATH_COMPRESSION
	}